

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O1

bool __thiscall
CCoinsViewDB::BatchWrite(CCoinsViewDB *this,CoinsViewCacheCursor *cursor,uint256 *hashBlock)

{
  DataStream *s;
  CoinsCachePair *pCVar1;
  CoinsViewCacheCursor *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string_view source_file;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint256 *puVar9;
  uchar *puVar10;
  Logger *pLVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  CoinsViewCacheCursor *pCVar15;
  uint uVar16;
  uint uVar17;
  uint *in_R8;
  int iVar18;
  CoinsCachePair *pCVar19;
  CoinsViewCacheCursor *pCVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Span<const_std::byte> key;
  Span<const_std::byte> key_00;
  string_view str;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function_03;
  CDBBatch batch;
  uint256 old_tip;
  uint256 hashBestChain;
  char *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  uint local_160;
  int local_15c;
  CDBBatch local_158;
  undefined1 local_f8 [16];
  pointer local_e8;
  uchar auStack_e0 [104];
  string local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&local_158,
                     (this->m_db)._M_t.
                     super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                     super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
  puVar9 = (uint256 *)
           std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (hashBlock,hashBlock + 1);
  if (puVar9 == hashBlock + 1) {
LAB_003d9ee7:
    __assert_fail("!hashBlock.IsNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp"
                  ,0x5f,
                  "virtual bool CCoinsViewDB::BatchWrite(CoinsViewCacheCursor &, const uint256 &)");
  }
  local_58._16_8_ = (pointer)0x0;
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  bVar6 = CDBWrapper::Read<unsigned_char,uint256>
                    ((this->m_db)._M_t.
                     super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                     super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,"BHC12CCoinsViewDB",
                     (uint256 *)local_58);
  if (bVar6) {
    local_e8 = (pointer)local_58._16_8_;
    auStack_e0[0] = local_58[0x18];
    auStack_e0[1] = local_58[0x19];
    auStack_e0[2] = local_58[0x1a];
    auStack_e0[3] = local_58[0x1b];
    auStack_e0[4] = local_58[0x1c];
    auStack_e0[5] = local_58[0x1d];
    auStack_e0[6] = local_58[0x1e];
    auStack_e0[7] = local_58[0x1f];
    local_f8._0_8_ = local_58._0_8_;
    local_f8._8_8_ = local_58._8_8_;
  }
  else {
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_e8 = (pointer)0x0;
    auStack_e0[0] = '\0';
    auStack_e0[1] = '\0';
    auStack_e0[2] = '\0';
    auStack_e0[3] = '\0';
    auStack_e0[4] = '\0';
    auStack_e0[5] = '\0';
    auStack_e0[6] = '\0';
    auStack_e0[7] = '\0';
  }
  puVar10 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (local_f8,auStack_e0 + 8);
  if (puVar10 == auStack_e0 + 8) {
    GetHeadBlocks((vector<uint256,_std::allocator<uint256>_> *)local_58,this);
    uVar3 = local_58._0_8_;
    if (local_58._8_8_ - local_58._0_8_ == 0x40) {
      auVar25[0] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0] ==
                    *(uchar *)local_58._0_8_);
      auVar25[1] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[1] ==
                    *(uchar *)(local_58._0_8_ + 1));
      auVar25[2] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[2] ==
                    *(uchar *)(local_58._0_8_ + 2));
      auVar25[3] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[3] ==
                    *(uchar *)(local_58._0_8_ + 3));
      auVar25[4] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[4] ==
                    *(uchar *)(local_58._0_8_ + 4));
      auVar25[5] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[5] ==
                    *(uchar *)(local_58._0_8_ + 5));
      auVar25[6] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[6] ==
                    *(uchar *)(local_58._0_8_ + 6));
      auVar25[7] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[7] ==
                    *(uchar *)(local_58._0_8_ + 7));
      auVar25[8] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[8] ==
                    *(uchar *)(local_58._0_8_ + 8));
      auVar25[9] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[9] ==
                    *(uchar *)(local_58._0_8_ + 9));
      auVar25[10] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[10] ==
                     *(uchar *)(local_58._0_8_ + 10));
      auVar25[0xb] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      *(uchar *)(local_58._0_8_ + 0xb));
      auVar25[0xc] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      *(uchar *)(local_58._0_8_ + 0xc));
      auVar25[0xd] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      *(uchar *)(local_58._0_8_ + 0xd));
      auVar25[0xe] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      *(uchar *)(local_58._0_8_ + 0xe));
      auVar25[0xf] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      *(uchar *)(local_58._0_8_ + 0xf));
      auVar21[0] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x10] ==
                    *(uchar *)(local_58._0_8_ + 0x10));
      auVar21[1] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x11] ==
                    *(uchar *)(local_58._0_8_ + 0x11));
      auVar21[2] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x12] ==
                    *(uchar *)(local_58._0_8_ + 0x12));
      auVar21[3] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x13] ==
                    *(uchar *)(local_58._0_8_ + 0x13));
      auVar21[4] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x14] ==
                    *(uchar *)(local_58._0_8_ + 0x14));
      auVar21[5] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x15] ==
                    *(uchar *)(local_58._0_8_ + 0x15));
      auVar21[6] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x16] ==
                    *(uchar *)(local_58._0_8_ + 0x16));
      auVar21[7] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x17] ==
                    *(uchar *)(local_58._0_8_ + 0x17));
      auVar21[8] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x18] ==
                    *(uchar *)(local_58._0_8_ + 0x18));
      auVar21[9] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x19] ==
                    *(uchar *)(local_58._0_8_ + 0x19));
      auVar21[10] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                     *(uchar *)(local_58._0_8_ + 0x1a));
      auVar21[0xb] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                      *(uchar *)(local_58._0_8_ + 0x1b));
      auVar21[0xc] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                      *(uchar *)(local_58._0_8_ + 0x1c));
      auVar21[0xd] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                      *(uchar *)(local_58._0_8_ + 0x1d));
      auVar21[0xe] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                      *(uchar *)(local_58._0_8_ + 0x1e));
      auVar21[0xf] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                      *(uchar *)(local_58._0_8_ + 0x1f));
      auVar21 = auVar21 & auVar25;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
        pLVar11 = LogInstance();
        bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar11,COINDB,Error);
        if (bVar6) {
          in_stack_fffffffffffffe60 =
               "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n"
          ;
          in_R8 = (uint *)0x67;
          logging_function._M_str = "BatchWrite";
          logging_function._M_len = 10;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
          source_file_00._M_len = 0x51;
          ::LogPrintf_<>(logging_function,source_file_00,0x67,COINDB,Error,
                         "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n"
                        );
        }
      }
      auVar26[0] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0] == *(uchar *)uVar3);
      auVar26[1] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[1] == *(uchar *)(uVar3 + 1))
      ;
      auVar26[2] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[2] == *(uchar *)(uVar3 + 2))
      ;
      auVar26[3] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[3] == *(uchar *)(uVar3 + 3))
      ;
      auVar26[4] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[4] == *(uchar *)(uVar3 + 4))
      ;
      auVar26[5] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[5] == *(uchar *)(uVar3 + 5))
      ;
      auVar26[6] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[6] == *(uchar *)(uVar3 + 6))
      ;
      auVar26[7] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[7] == *(uchar *)(uVar3 + 7))
      ;
      auVar26[8] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[8] == *(uchar *)(uVar3 + 8))
      ;
      auVar26[9] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[9] == *(uchar *)(uVar3 + 9))
      ;
      auVar26[10] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[10] ==
                     *(uchar *)(uVar3 + 10));
      auVar26[0xb] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      *(uchar *)(uVar3 + 0xb));
      auVar26[0xc] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      *(uchar *)(uVar3 + 0xc));
      auVar26[0xd] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      *(uchar *)(uVar3 + 0xd));
      auVar26[0xe] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      *(uchar *)(uVar3 + 0xe));
      auVar26[0xf] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      *(uchar *)(uVar3 + 0xf));
      auVar22[0] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x10] ==
                    *(uchar *)(uVar3 + 0x10));
      auVar22[1] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x11] ==
                    *(uchar *)(uVar3 + 0x11));
      auVar22[2] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x12] ==
                    *(uchar *)(uVar3 + 0x12));
      auVar22[3] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x13] ==
                    *(uchar *)(uVar3 + 0x13));
      auVar22[4] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x14] ==
                    *(uchar *)(uVar3 + 0x14));
      auVar22[5] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x15] ==
                    *(uchar *)(uVar3 + 0x15));
      auVar22[6] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x16] ==
                    *(uchar *)(uVar3 + 0x16));
      auVar22[7] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x17] ==
                    *(uchar *)(uVar3 + 0x17));
      auVar22[8] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x18] ==
                    *(uchar *)(uVar3 + 0x18));
      auVar22[9] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x19] ==
                    *(uchar *)(uVar3 + 0x19));
      auVar22[10] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                     *(uchar *)(uVar3 + 0x1a));
      auVar22[0xb] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                      *(uchar *)(uVar3 + 0x1b));
      auVar22[0xc] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                      *(uchar *)(uVar3 + 0x1c));
      auVar22[0xd] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                      *(uchar *)(uVar3 + 0x1d));
      auVar22[0xe] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                      *(uchar *)(uVar3 + 0x1e));
      auVar22[0xf] = -((hashBlock->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                      *(uchar *)(uVar3 + 0x1f));
      auVar22 = auVar22 & auVar26;
      if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
        __assert_fail("old_heads[0] == hashBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp"
                      ,0x69,
                      "virtual bool CCoinsViewDB::BatchWrite(CoinsViewCacheCursor &, const uint256 &)"
                     );
      }
      local_f8._0_8_ =
           *(undefined8 *)(((pointer)(uVar3 + 0x20))->super_base_blob<256U>).m_data._M_elems;
      local_f8._8_8_ = *(undefined8 *)(uVar3 + 0x28);
      local_e8 = *(pointer *)(uVar3 + 0x30);
      auStack_e0._0_8_ = *(undefined8 *)(uVar3 + 0x38);
    }
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3,local_58._16_8_ - uVar3);
    }
  }
  CDBBatch::Erase<unsigned_char>(&local_158,"BHC12CCoinsViewDB");
  local_58._0_8_ = (CoinsCachePair *)0x0;
  local_58._8_8_ = (uint256 *)0x0;
  local_58._16_8_ = (uint256 *)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::reserve
            ((vector<uint256,_std::allocator<uint256>_> *)local_58,2);
  if (local_58._8_8_ == local_58._16_8_) {
    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
              ((vector<uint256,std::allocator<uint256>> *)local_58,(iterator)local_58._8_8_,
               hashBlock);
  }
  else {
    uVar4 = *(undefined8 *)(hashBlock->super_base_blob<256U>).m_data._M_elems;
    uVar5 = *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8);
    uVar3 = *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 0x10) =
         *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 0x18) = uVar3;
    *(undefined8 *)(((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems = uVar4;
    *(undefined8 *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 8) = uVar5;
    local_58._8_8_ = local_58._8_8_ + 0x20;
  }
  if (local_58._8_8_ == local_58._16_8_) {
    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256&>
              ((vector<uint256,std::allocator<uint256>> *)local_58,(iterator)local_58._8_8_,
               (uint256 *)local_f8);
  }
  else {
    *(pointer *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 0x10) = local_e8;
    *(undefined8 *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 0x18) =
         auStack_e0._0_8_;
    *(undefined8 *)(((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems = local_f8._0_8_;
    *(undefined8 *)((((base_blob<256U> *)local_58._8_8_)->m_data)._M_elems + 8) = local_f8._8_8_;
    local_58._8_8_ = local_58._8_8_ + 0x20;
  }
  CDBBatch::Write<unsigned_char,std::vector<uint256,std::allocator<uint256>>>
            (&local_158,"HC12CCoinsViewDB",(vector<uint256,_std::allocator<uint256>_> *)local_58);
  if ((CoinsCachePair *)local_58._0_8_ != (CoinsCachePair *)0x0) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
  }
  pCVar19 = (cursor->m_sentinel->second).m_next;
  if (pCVar19 == cursor->m_sentinel) {
    iVar18 = 0;
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    iVar18 = 0;
    do {
      if (((pCVar19->second).m_flags & 1) != 0) {
        local_58[8] = 0x43;
        s = &local_158.ssKey;
        local_58._0_8_ = pCVar19;
        if ((pCVar19->second).coin.out.nValue == -1) {
          std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                    (&s->vch,local_158.ssKey.m_read_pos + 0x40);
          local_78._M_dataplus._M_p = (pointer)(local_58._0_8_ + 0x20);
          SerializeMany<DataStream,unsigned_char,transaction_identifier<false>,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
                    (s,local_58 + 8,(transaction_identifier<false> *)local_58._0_8_,
                     (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_78);
          key_00.m_data =
               local_158.ssKey.vch.
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + local_158.ssKey.m_read_pos;
          key_00.m_size =
               (long)local_158.ssKey.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)key_00.m_data;
          CDBBatch::EraseImpl(&local_158,key_00);
          psVar12 = &local_158.ssKey.m_read_pos;
          if (local_158.ssKey.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_158.ssKey.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_158.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_158.ssKey.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        else {
          std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                    (&s->vch,local_158.ssKey.m_read_pos + 0x40);
          std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                    (&local_158.ssValue.vch,local_158.ssValue.m_read_pos + 0x400);
          local_78._M_dataplus._M_p = (pointer)(local_58._0_8_ + 0x20);
          SerializeMany<DataStream,unsigned_char,transaction_identifier<false>,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
                    (s,local_58 + 8,(transaction_identifier<false> *)local_58._0_8_,
                     (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_78);
          Coin::Serialize<DataStream>(&(pCVar19->second).coin,&local_158.ssValue);
          key.m_data = local_158.ssKey.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + local_158.ssKey.m_read_pos;
          key.m_size = (long)local_158.ssKey.vch.
                             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)key.m_data;
          CDBBatch::WriteImpl(&local_158,key,&local_158.ssValue);
          if (local_158.ssKey.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_158.ssKey.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_158.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_158.ssKey.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          local_158.ssKey.m_read_pos = 0;
          psVar12 = &local_158.ssValue.m_read_pos;
          if (local_158.ssValue.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_158.ssValue.vch.
              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_158.ssValue.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.ssValue.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        *psVar12 = 0;
        iVar18 = iVar18 + 1;
      }
      pCVar1 = (pCVar19->second).m_next;
      if (cursor->m_will_erase == false) {
        if ((pCVar19->second).coin.out.nValue == -1) {
          uVar13 = (ulong)(pCVar19->second).coin.out.scriptPubKey.super_CScriptBase._union.
                          indirect_contents.capacity;
          if ((pCVar19->second).coin.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
            uVar13 = 0;
          }
          uVar14 = 0;
          if ((int)uVar13 != 0) {
            uVar14 = uVar13 + 0x1f & 0xfffffffffffffff0;
          }
          *cursor->m_usage = *cursor->m_usage - uVar14;
          std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&cursor->m_map->_M_h,pCVar19);
        }
        else if ((pCVar19->second).m_flags != '\0') {
          (pCVar1->second).m_prev = (pCVar19->second).m_prev;
          (((pCVar19->second).m_prev)->second).m_next = pCVar1;
          (pCVar19->second).m_flags = '\0';
        }
      }
      if ((this->m_options).batch_write_bytes < local_158.size_estimate) {
        pLVar11 = LogInstance();
        bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar11,COINDB,Debug);
        if (bVar6) {
          auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)local_158.size_estimate);
          auVar23._8_4_ = (int)(local_158.size_estimate >> 0x20);
          auVar23._12_4_ = 0x45300000;
          local_58._0_8_ =
               ((auVar23._8_8_ - 1.9342813113834067e+25) + (auVar23._0_8_ - 4503599627370496.0)) *
               9.5367431640625e-07;
          in_R8 = (uint *)0x81;
          logging_function_00._M_str = "BatchWrite";
          logging_function_00._M_len = 10;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
          source_file_01._M_len = 0x51;
          LogPrintf_<double>(logging_function_00,source_file_01,0x81,
                             IPC|COINDB|PROXY|REINDEX|ESTIMATEFEE|RPC|HTTP|MEMPOOL|TOR,
                             (Level)local_58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
        }
        CDBWrapper::WriteBatch
                  ((this->m_db)._M_t.
                   super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                   super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                   super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&local_158,false);
        CDBBatch::Clear(&local_158);
        if ((this->m_options).simulate_crash_ratio != 0) {
          if (BatchWrite(CoinsViewCacheCursor&,uint256_const&)::rng == '\0') {
            BatchWrite();
          }
          uVar16 = (this->m_options).simulate_crash_ratio - 1;
          if (uVar16 == 0) {
            uVar8 = 0x20;
          }
          else {
            uVar8 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            uVar8 = uVar8 ^ 0x1f;
          }
          pCVar20 = cursor;
          do {
            pCVar15 = (CoinsViewCacheCursor *)
                      RandomMixin<FastRandomContext>::randbits
                                (&BatchWrite::rng.super_RandomMixin<FastRandomContext>,0x20 - uVar8)
            ;
            pCVar2 = pCVar20;
            if (pCVar15 <= (CoinsViewCacheCursor *)(ulong)uVar16) {
              pCVar2 = pCVar15;
            }
            pCVar20 = (CoinsViewCacheCursor *)((ulong)pCVar2 & 0xffffffff);
          } while ((CoinsViewCacheCursor *)(ulong)uVar16 < pCVar15);
          if ((int)pCVar2 == 0) {
            logging_function_02._M_str = "BatchWrite";
            logging_function_02._M_len = 10;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp"
            ;
            source_file_03._M_len = 0x51;
            ::LogPrintf_<>(logging_function_02,source_file_03,0x87,ALL,Info,
                           "Simulating a crash. Goodbye.\n");
            _Exit(0);
            goto LAB_003d9ee7;
          }
        }
      }
      uVar17 = uVar17 + 1;
      pCVar19 = pCVar1;
    } while (pCVar1 != cursor->m_sentinel);
  }
  CDBBatch::Erase<unsigned_char>(&local_158,"HC12CCoinsViewDB");
  CDBBatch::Write<unsigned_char,uint256>(&local_158,"BHC12CCoinsViewDB",hashBlock);
  pLVar11 = LogInstance();
  bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar11,COINDB,Debug);
  if (bVar6) {
    auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)local_158.size_estimate);
    auVar24._8_4_ = (int)(local_158.size_estimate >> 0x20);
    auVar24._12_4_ = 0x45300000;
    local_58._0_8_ =
         ((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0)) *
         9.5367431640625e-07;
    in_R8 = (uint *)0x92;
    logging_function_01._M_str = "BatchWrite";
    logging_function_01._M_len = 10;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
    source_file_02._M_len = 0x51;
    LogPrintf_<double>(logging_function_01,source_file_02,0x92,
                       IPC|COINDB|PROXY|REINDEX|ESTIMATEFEE|RPC|WALLETDB|HTTP|MEMPOOL|TOR|NET,
                       (Level)local_58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  }
  bVar6 = CDBWrapper::WriteBatch
                    ((this->m_db)._M_t.
                     super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                     super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&local_158,false);
  pLVar11 = LogInstance();
  bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar11,COINDB,Debug);
  if (bVar7) {
    local_160 = uVar17;
    local_15c = iVar18;
    pLVar11 = LogInstance();
    bVar7 = BCLog::Logger::Enabled(pLVar11);
    if (bVar7) {
      local_58._8_8_ = (uint256 *)0x0;
      local_58._16_8_ = local_58._16_8_ & 0xffffffffffffff00;
      local_58._0_8_ = (CoinsCachePair *)(local_58 + 0x10);
      tinyformat::format<unsigned_int,unsigned_int>
                (&local_78,
                 (tinyformat *)
                 "Committed %u changed transaction outputs (out of %u) to coin database...\n",
                 (char *)&local_15c,&local_160,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar11 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x51;
      local_78._M_string_length = 0x848807;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
      source_file._M_len = 0x51;
      str._M_str = (char *)local_58._0_8_;
      str._M_len = local_58._8_8_;
      logging_function_03._M_str = "BatchWrite";
      logging_function_03._M_len = 10;
      BCLog::Logger::LogPrintStr(pLVar11,str,logging_function_03,source_file,0x94,COINDB,Debug);
      if ((CoinsCachePair *)local_58._0_8_ != (CoinsCachePair *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
      }
    }
  }
  CDBBatch::~CDBBatch(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CCoinsViewDB::BatchWrite(CoinsViewCacheCursor& cursor, const uint256 &hashBlock) {
    CDBBatch batch(*m_db);
    size_t count = 0;
    size_t changed = 0;
    assert(!hashBlock.IsNull());

    uint256 old_tip = GetBestBlock();
    if (old_tip.IsNull()) {
        // We may be in the middle of replaying.
        std::vector<uint256> old_heads = GetHeadBlocks();
        if (old_heads.size() == 2) {
            if (old_heads[0] != hashBlock) {
                LogPrintLevel(BCLog::COINDB, BCLog::Level::Error, "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n");
            }
            assert(old_heads[0] == hashBlock);
            old_tip = old_heads[1];
        }
    }

    // In the first batch, mark the database as being in the middle of a
    // transition from old_tip to hashBlock.
    // A vector is used for future extensibility, as we may want to support
    // interrupting after partial writes from multiple independent reorgs.
    batch.Erase(DB_BEST_BLOCK);
    batch.Write(DB_HEAD_BLOCKS, Vector(hashBlock, old_tip));

    for (auto it{cursor.Begin()}; it != cursor.End();) {
        if (it->second.IsDirty()) {
            CoinEntry entry(&it->first);
            if (it->second.coin.IsSpent())
                batch.Erase(entry);
            else
                batch.Write(entry, it->second.coin);
            changed++;
        }
        count++;
        it = cursor.NextAndMaybeErase(*it);
        if (batch.SizeEstimate() > m_options.batch_write_bytes) {
            LogDebug(BCLog::COINDB, "Writing partial batch of %.2f MiB\n", batch.SizeEstimate() * (1.0 / 1048576.0));
            m_db->WriteBatch(batch);
            batch.Clear();
            if (m_options.simulate_crash_ratio) {
                static FastRandomContext rng;
                if (rng.randrange(m_options.simulate_crash_ratio) == 0) {
                    LogPrintf("Simulating a crash. Goodbye.\n");
                    _Exit(0);
                }
            }
        }
    }

    // In the last batch, mark the database as consistent with hashBlock again.
    batch.Erase(DB_HEAD_BLOCKS);
    batch.Write(DB_BEST_BLOCK, hashBlock);

    LogDebug(BCLog::COINDB, "Writing final batch of %.2f MiB\n", batch.SizeEstimate() * (1.0 / 1048576.0));
    bool ret = m_db->WriteBatch(batch);
    LogDebug(BCLog::COINDB, "Committed %u changed transaction outputs (out of %u) to coin database...\n", (unsigned int)changed, (unsigned int)count);
    return ret;
}